

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ClockingItemSyntax::ClockingItemSyntax
          (ClockingItemSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          ClockingDirectionSyntax *direction,
          SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls,Token semi)

{
  bool bVar1;
  ClockingDirectionSyntax *pCVar2;
  AttributeSpecSyntax *pAVar3;
  ClockingDirectionSyntax *in_RDX;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *in_RDI;
  size_t in_R8;
  pointer in_R9;
  AttributeSpecSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffffb0 [16];
  MemberSyntax *in_stack_ffffffffffffffc0;
  ClockingDirectionSyntax *local_38 [2];
  ClockingDirectionSyntax *local_28;
  size_t local_10;
  pointer local_8;
  
  local_28 = in_RDX;
  local_10 = in_R8;
  local_8 = in_R9;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0._12_4_,
             in_stack_ffffffffffffffb0._0_8_);
  local_38[0] = local_28;
  not_null<slang::syntax::ClockingDirectionSyntax_*>::
  not_null<slang::syntax::ClockingDirectionSyntax_*>
            ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)
             &in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode,local_38);
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::SeparatedSyntaxList
            (in_RDI,in_stack_ffffffffffffff88);
  in_RDI[2].super_SyntaxListBase.childCount = local_10;
  in_RDI[2].elements._M_ptr = local_8;
  pCVar2 = not_null<slang::syntax::ClockingDirectionSyntax_*>::operator->
                     ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0xa1e031);
  (pCVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
  in_RDI[1].elements._M_extent._M_extent_value = (size_t)in_RDI;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)0xa1e054);
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::AttributeSpecSyntax_*> *)
                       in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_false>
                          *)0xa1e093);
    (pAVar3->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::iterator_base<slang::syntax::AttributeSpecSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

ClockingItemSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, ClockingDirectionSyntax& direction, const SeparatedSyntaxList<AttributeSpecSyntax>& decls, Token semi) :
        MemberSyntax(SyntaxKind::ClockingItem, attributes), direction(&direction), decls(decls), semi(semi) {
        this->direction->parent = this;
        this->decls.parent = this;
        for (auto child : this->decls)
            child->parent = this;
    }